

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

void __thiscall
spvtools::opt::IRContext::IRContext(IRContext *this,spv_target_env env,MessageConsumer *c)

{
  spv_context psVar1;
  Module *this_00;
  pointer this_01;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> local_40;
  MessageConsumer *local_20;
  MessageConsumer *c_local;
  IRContext *pIStack_10;
  spv_target_env env_local;
  IRContext *this_local;
  
  local_20 = c;
  c_local._4_4_ = env;
  pIStack_10 = this;
  psVar1 = spvContextCreate(env);
  this->syntax_context_ = psVar1;
  AssemblyGrammar::AssemblyGrammar(&this->grammar_,this->syntax_context_);
  this->unique_id_ = 0;
  this_00 = (Module *)::operator_new(0x590);
  Module::Module(this_00);
  std::unique_ptr<spvtools::opt::Module,std::default_delete<spvtools::opt::Module>>::
  unique_ptr<std::default_delete<spvtools::opt::Module>,void>
            ((unique_ptr<spvtools::opt::Module,std::default_delete<spvtools::opt::Module>> *)
             &this->module_,this_00);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function(&this->consumer_,c);
  std::
  unique_ptr<spvtools::opt::analysis::DefUseManager,std::default_delete<spvtools::opt::analysis::DefUseManager>>
  ::unique_ptr<std::default_delete<spvtools::opt::analysis::DefUseManager>,void>
            ((unique_ptr<spvtools::opt::analysis::DefUseManager,std::default_delete<spvtools::opt::analysis::DefUseManager>>
              *)&this->def_use_mgr_,(nullptr_t)0x0);
  std::
  unique_ptr<spvtools::opt::analysis::DecorationManager,std::default_delete<spvtools::opt::analysis::DecorationManager>>
  ::unique_ptr<std::default_delete<spvtools::opt::analysis::DecorationManager>,void>
            ((unique_ptr<spvtools::opt::analysis::DecorationManager,std::default_delete<spvtools::opt::analysis::DecorationManager>>
              *)&this->decoration_mgr_);
  std::unique_ptr<spvtools::opt::FeatureManager,std::default_delete<spvtools::opt::FeatureManager>>
  ::unique_ptr<std::default_delete<spvtools::opt::FeatureManager>,void>
            ((unique_ptr<spvtools::opt::FeatureManager,std::default_delete<spvtools::opt::FeatureManager>>
              *)&this->feature_mgr_,(nullptr_t)0x0);
  std::
  unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>_>
  ::unordered_map(&this->instr_to_block_);
  std::
  unordered_map<unsigned_int,_spvtools::opt::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>_>
  ::unordered_map(&this->id_to_func_);
  this->valid_analyses_ = kAnalysisNone;
  std::
  unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::unordered_map(&this->combinator_ops_);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(&this->builtin_var_id_map_);
  std::unique_ptr<spvtools::opt::CFG,std::default_delete<spvtools::opt::CFG>>::
  unique_ptr<std::default_delete<spvtools::opt::CFG>,void>
            ((unique_ptr<spvtools::opt::CFG,std::default_delete<spvtools::opt::CFG>> *)&this->cfg_);
  std::
  map<const_spvtools::opt::Function_*,_spvtools::opt::DominatorAnalysis,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::DominatorAnalysis>_>_>
  ::map(&this->dominator_trees_);
  std::
  map<const_spvtools::opt::Function_*,_spvtools::opt::PostDominatorAnalysis,_std::less<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::PostDominatorAnalysis>_>_>
  ::map(&this->post_dominator_trees_);
  std::
  unordered_map<const_spvtools::opt::Function_*,_spvtools::opt::LoopDescriptor,_std::hash<const_spvtools::opt::Function_*>,_std::equal_to<const_spvtools::opt::Function_*>,_std::allocator<std::pair<const_spvtools::opt::Function_*const,_spvtools::opt::LoopDescriptor>_>_>
  ::unordered_map(&this->loop_descriptors_);
  std::
  unique_ptr<spvtools::opt::analysis::ConstantManager,std::default_delete<spvtools::opt::analysis::ConstantManager>>
  ::unique_ptr<std::default_delete<spvtools::opt::analysis::ConstantManager>,void>
            ((unique_ptr<spvtools::opt::analysis::ConstantManager,std::default_delete<spvtools::opt::analysis::ConstantManager>>
              *)&this->constant_mgr_,(nullptr_t)0x0);
  std::
  unique_ptr<spvtools::opt::analysis::TypeManager,std::default_delete<spvtools::opt::analysis::TypeManager>>
  ::unique_ptr<std::default_delete<spvtools::opt::analysis::TypeManager>,void>
            ((unique_ptr<spvtools::opt::analysis::TypeManager,std::default_delete<spvtools::opt::analysis::TypeManager>>
              *)&this->type_mgr_,(nullptr_t)0x0);
  std::
  unique_ptr<spvtools::opt::analysis::DebugInfoManager,std::default_delete<spvtools::opt::analysis::DebugInfoManager>>
  ::unique_ptr<std::default_delete<spvtools::opt::analysis::DebugInfoManager>,void>
            ((unique_ptr<spvtools::opt::analysis::DebugInfoManager,std::default_delete<spvtools::opt::analysis::DebugInfoManager>>
              *)&this->debug_info_mgr_);
  std::
  unique_ptr<std::multimap<unsigned_int,spvtools::opt::Instruction*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>,std::default_delete<std::multimap<unsigned_int,spvtools::opt::Instruction*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>>>
  ::
  unique_ptr<std::default_delete<std::multimap<unsigned_int,spvtools::opt::Instruction*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>>,void>
            ((unique_ptr<std::multimap<unsigned_int,spvtools::opt::Instruction*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>,std::default_delete<std::multimap<unsigned_int,spvtools::opt::Instruction*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>>>
              *)&this->id_to_name_,(nullptr_t)0x0);
  std::
  unique_ptr<spvtools::opt::ScalarEvolutionAnalysis,std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>>
  ::unique_ptr<std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>,void>
            ((unique_ptr<spvtools::opt::ScalarEvolutionAnalysis,std::default_delete<spvtools::opt::ScalarEvolutionAnalysis>>
              *)&this->scalar_evolution_analysis_);
  std::
  unique_ptr<spvtools::opt::LivenessAnalysis,std::default_delete<spvtools::opt::LivenessAnalysis>>::
  unique_ptr<std::default_delete<spvtools::opt::LivenessAnalysis>,void>
            ((unique_ptr<spvtools::opt::LivenessAnalysis,std::default_delete<spvtools::opt::LivenessAnalysis>>
              *)&this->reg_pressure_);
  std::
  unique_ptr<spvtools::opt::ValueNumberTable,std::default_delete<spvtools::opt::ValueNumberTable>>::
  unique_ptr<std::default_delete<spvtools::opt::ValueNumberTable>,void>
            ((unique_ptr<spvtools::opt::ValueNumberTable,std::default_delete<spvtools::opt::ValueNumberTable>>
              *)&this->vn_table_);
  std::
  unique_ptr<spvtools::opt::InstructionFolder,std::default_delete<spvtools::opt::InstructionFolder>>
  ::unique_ptr<std::default_delete<spvtools::opt::InstructionFolder>,void>
            ((unique_ptr<spvtools::opt::InstructionFolder,std::default_delete<spvtools::opt::InstructionFolder>>
              *)&this->inst_folder_);
  std::
  unique_ptr<spvtools::opt::StructuredCFGAnalysis,std::default_delete<spvtools::opt::StructuredCFGAnalysis>>
  ::unique_ptr<std::default_delete<spvtools::opt::StructuredCFGAnalysis>,void>
            ((unique_ptr<spvtools::opt::StructuredCFGAnalysis,std::default_delete<spvtools::opt::StructuredCFGAnalysis>>
              *)&this->struct_cfg_analysis_);
  std::
  unique_ptr<spvtools::opt::analysis::LivenessManager,std::default_delete<spvtools::opt::analysis::LivenessManager>>
  ::unique_ptr<std::default_delete<spvtools::opt::analysis::LivenessManager>,void>
            ((unique_ptr<spvtools::opt::analysis::LivenessManager,std::default_delete<spvtools::opt::analysis::LivenessManager>>
              *)&this->liveness_mgr_);
  this->max_id_bound_ = 0x3fffff;
  this->preserve_bindings_ = false;
  this->preserve_spec_constants_ = false;
  psVar1 = this->syntax_context_;
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  function(&local_40,&this->consumer_);
  SetContextMessageConsumer(psVar1,&local_40);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  ~function(&local_40);
  this_01 = std::unique_ptr<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>::
            operator->(&this->module_);
  Module::SetContext(this_01,this);
  return;
}

Assistant:

IRContext(spv_target_env env, MessageConsumer c)
      : syntax_context_(spvContextCreate(env)),
        grammar_(syntax_context_),
        unique_id_(0),
        module_(new Module()),
        consumer_(std::move(c)),
        def_use_mgr_(nullptr),
        feature_mgr_(nullptr),
        valid_analyses_(kAnalysisNone),
        constant_mgr_(nullptr),
        type_mgr_(nullptr),
        id_to_name_(nullptr),
        max_id_bound_(kDefaultMaxIdBound),
        preserve_bindings_(false),
        preserve_spec_constants_(false) {
    SetContextMessageConsumer(syntax_context_, consumer_);
    module_->SetContext(this);
  }